

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

StackNode * __thiscall
KokkosTools::SpaceTimeStack::StackNode::get_child
          (StackNode *this,string *child_name,StackKind child_kind)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<KokkosTools::SpaceTimeStack::StackNode>,_bool> pVar2;
  StackNode candidate;
  StackNode local_b0;
  
  StackNode(&local_b0,this,child_name,child_kind);
  iVar1 = std::
          _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
          ::find(&(this->children)._M_t,&local_b0);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->children)._M_t._M_impl.super__Rb_tree_header) {
    pVar2 = std::
            _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
            ::_M_emplace_unique<KokkosTools::SpaceTimeStack::StackNode>
                      (&(this->children)._M_t,&local_b0);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("res.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0xb0,
                    "StackNode *KokkosTools::SpaceTimeStack::StackNode::get_child(std::string &&, StackKind)"
                   );
    }
  }
  ~StackNode(&local_b0);
  return (StackNode *)(iVar1._M_node + 1);
}

Assistant:

StackNode* get_child(std::string&& child_name, StackKind child_kind) {
    StackNode candidate(this, std::move(child_name), child_kind);
    auto it = children.find(candidate);
    if (it == children.end()) {
      auto res = children.emplace(std::move(candidate));
      it       = res.first;
      assert(res.second);
    }
    return const_cast<StackNode*>(&(*(it)));
  }